

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

float * ma_dr_flac_open_memory_and_read_pcm_frames_f32
                  (void *data,size_t dataSize,uint *channels,uint *sampleRate,
                  ma_uint64 *totalPCMFrameCount,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac *pFlac;
  float *pfVar1;
  
  if (sampleRate != (uint *)0x0) {
    *sampleRate = 0;
  }
  if (channels != (uint *)0x0) {
    *channels = 0;
  }
  if (totalPCMFrameCount != (ma_uint64 *)0x0) {
    *totalPCMFrameCount = 0;
  }
  pFlac = ma_dr_flac_open_memory(data,dataSize,pAllocationCallbacks);
  if (pFlac != (ma_dr_flac *)0x0) {
    pfVar1 = ma_dr_flac__full_read_and_close_f32(pFlac,channels,sampleRate,totalPCMFrameCount);
    return pfVar1;
  }
  return (float *)0x0;
}

Assistant:

MA_API float* ma_dr_flac_open_memory_and_read_pcm_frames_f32(const void* data, size_t dataSize, unsigned int* channels, unsigned int* sampleRate, ma_uint64* totalPCMFrameCount, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (sampleRate) {
        *sampleRate = 0;
    }
    if (channels) {
        *channels = 0;
    }
    if (totalPCMFrameCount) {
        *totalPCMFrameCount = 0;
    }
    pFlac = ma_dr_flac_open_memory(data, dataSize, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_f32(pFlac, channels, sampleRate, totalPCMFrameCount);
}